

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

GLFWvidmode * glfwGetVideoModes(GLFWmonitor *handle,int *count)

{
  int iVar1;
  GLFWvidmode *pGVar2;
  
  *count = 0;
  if (_glfwInitialized == '\0') {
    pGVar2 = (GLFWvidmode *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    iVar1 = refreshVideoModes((_GLFWmonitor *)handle);
    if (iVar1 == 0) {
      pGVar2 = (GLFWvidmode *)0x0;
    }
    else {
      *count = *(int *)(handle + 0x18);
      pGVar2 = *(GLFWvidmode **)(handle + 0x10);
    }
  }
  return pGVar2;
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoModes(GLFWmonitor* handle, int* count)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!refreshVideoModes(monitor))
        return NULL;

    *count = monitor->modeCount;
    return monitor->modes;
}